

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O1

int Abc_NtkMiterSatCreateInt(sat_solver *pSat,Abc_Ntk_t *pNtk)

{
  uint uVar1;
  long *plVar2;
  Abc_Obj_t *pAVar3;
  int iVar4;
  long lVar5;
  uint *__ptr;
  void *pvVar6;
  Vec_Ptr_t *vNodes;
  void **ppvVar7;
  Vec_Int_t *vVars;
  int *piVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Obj_t *pAVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  Abc_Obj_t *pNodeE;
  Abc_Obj_t *pNodeT;
  Abc_Obj_t *local_48;
  Abc_Obj_t *local_40;
  Abc_Obj_t *local_38;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                  ,0x1de,"int Abc_NtkMiterSatCreateInt(sat_solver *, Abc_Ntk_t *)");
  }
  pVVar10 = pNtk->vCis;
  if (0 < pVVar10->nSize) {
    lVar5 = 0;
    do {
      *(undefined8 *)((long)pVVar10->pArray[lVar5] + 0x40) = 0;
      lVar5 = lVar5 + 1;
      pVVar10 = pNtk->vCis;
    } while (lVar5 < pVVar10->nSize);
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 1000;
  __ptr[1] = 0;
  pvVar6 = malloc(8000);
  *(void **)(__ptr + 2) = pvVar6;
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vNodes->pArray = ppvVar7;
  vVars = (Vec_Int_t *)malloc(0x10);
  vVars->nCap = 100;
  vVars->nSize = 0;
  piVar8 = (int *)malloc(400);
  vVars->pArray = piVar8;
  pAVar9 = Abc_AigConst1(pNtk);
  pAVar9->field_0x14 = pAVar9->field_0x14 | 0x10;
  (pAVar9->field_6).pTemp = (void *)0x0;
  __ptr[1] = 1;
  **(undefined8 **)(__ptr + 2) = pAVar9;
  Abc_NtkClauseTriv(pSat,pAVar9,vVars);
  vNodes->nSize = 0;
  pVVar10 = pNtk->vCos;
  if (0 < pVVar10->nSize) {
    lVar5 = 0;
    do {
      plVar2 = (long *)pVVar10->pArray[lVar5];
      lVar14 = *(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      if ((*(uint *)(lVar14 + 0x14) & 0x10) == 0) {
        *(uint *)(lVar14 + 0x14) = *(uint *)(lVar14 + 0x14) | 0x10;
        uVar16 = __ptr[1];
        *(long *)(lVar14 + 0x40) = (long)(int)uVar16;
        uVar1 = *__ptr;
        if (uVar16 == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc(0x80);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),0x80);
            }
            uVar12 = 0x10;
          }
          else {
            uVar12 = uVar1 * 2;
            if ((int)uVar12 <= (int)uVar1) goto LAB_0030750c;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar6 = malloc((ulong)uVar1 << 4);
            }
            else {
              pvVar6 = realloc(*(void **)(__ptr + 2),(ulong)uVar1 << 4);
            }
          }
          *(void **)(__ptr + 2) = pvVar6;
          *__ptr = uVar12;
        }
LAB_0030750c:
        __ptr[1] = uVar16 + 1;
        *(long *)(*(long *)(__ptr + 2) + (long)(int)uVar16 * 8) = lVar14;
      }
      uVar16 = *(uint *)((long)plVar2 + 0x14);
      uVar15 = *(ulong *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
      uVar1 = vNodes->nCap;
      if (vNodes->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc(0x80);
          }
          else {
            ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar1 * 2;
          if (iVar4 <= (int)uVar1) goto LAB_003075a0;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
          }
        }
        vNodes->pArray = ppvVar7;
        vNodes->nCap = iVar4;
      }
LAB_003075a0:
      iVar4 = vNodes->nSize;
      vNodes->nSize = iVar4 + 1;
      vNodes->pArray[iVar4] = (void *)(uVar16 >> 10 & 1 ^ uVar15);
      lVar5 = lVar5 + 1;
      pVVar10 = pNtk->vCos;
    } while (lVar5 < pVVar10->nSize);
  }
  iVar4 = Abc_NtkClauseTop(pSat,vNodes,vVars);
  if (iVar4 == 0) {
    iVar4 = 0;
  }
  else {
    uVar16 = __ptr[1];
    if ((int)uVar16 < 1) {
      iVar4 = 1;
    }
    else {
      pvVar6 = *(void **)(__ptr + 2);
      lVar5 = 0;
      do {
        pAVar9 = *(Abc_Obj_t **)((long)pvVar6 + lVar5 * 8);
        if (((ulong)pAVar9 & 1) != 0) {
          *(void **)(__ptr + 2) = pvVar6;
          __ptr[1] = uVar16;
          __assert_fail("!Abc_ObjIsComplement(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcSat.c"
                        ,0x20f,"int Abc_NtkMiterSatCreateInt(sat_solver *, Abc_Ntk_t *)");
        }
        if (pAVar9->pNtk->ntkType != ABC_NTK_STRASH) {
          *(void **)(__ptr + 2) = pvVar6;
          __ptr[1] = uVar16;
          __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                        ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if ((pAVar9->vFanins).nSize == 2) {
          iVar4 = Abc_NodeIsMuxType(pAVar9);
          if (iVar4 == 0) {
            Abc_NtkCollectSupergate(pAVar9,1,vNodes);
            iVar4 = vNodes->nSize;
            if (0 < iVar4) {
              lVar14 = 0;
              do {
                uVar15 = (ulong)vNodes->pArray[lVar14] & 0xfffffffffffffffe;
                if ((*(uint *)(uVar15 + 0x14) & 0x10) == 0) {
                  *(uint *)(uVar15 + 0x14) = *(uint *)(uVar15 + 0x14) | 0x10;
                  lVar13 = (long)(int)uVar16;
                  *(long *)(uVar15 + 0x40) = lVar13;
                  uVar1 = *__ptr;
                  if (uVar16 == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pvVar6 == (void *)0x0) {
                        pvVar6 = malloc(0x80);
                      }
                      else {
                        pvVar6 = realloc(pvVar6,0x80);
                      }
                      uVar12 = 0x10;
                    }
                    else {
                      uVar12 = uVar1 * 2;
                      if ((int)uVar12 <= (int)uVar1) goto LAB_00307751;
                      if (pvVar6 == (void *)0x0) {
                        pvVar6 = malloc((ulong)uVar1 << 4);
                      }
                      else {
                        pvVar6 = realloc(pvVar6,(ulong)uVar1 << 4);
                      }
                    }
                    *__ptr = uVar12;
                  }
LAB_00307751:
                  uVar16 = uVar16 + 1;
                  *(ulong *)((long)pvVar6 + lVar13 * 8) = uVar15;
                }
                lVar14 = lVar14 + 1;
                iVar4 = vNodes->nSize;
              } while (lVar14 < iVar4);
            }
            if (iVar4 == 0) {
              iVar4 = Abc_NtkClauseTriv(pSat,(Abc_Obj_t *)((ulong)pAVar9 | 1),vVars);
            }
            else {
              iVar4 = Abc_NtkClauseAnd(pSat,pAVar9,vNodes,vVars);
            }
          }
          else {
            nMuxes = nMuxes + 1;
            pAVar11 = Abc_NodeRecognizeMux(pAVar9,&local_40,&local_48);
            vNodes->nSize = 0;
            if (vNodes->nCap == 0) {
              if (vNodes->pArray == (void **)0x0) {
                ppvVar7 = (void **)malloc(0x80);
              }
              else {
                ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
              }
              vNodes->pArray = ppvVar7;
              vNodes->nCap = 0x10;
            }
            pAVar3 = local_40;
            iVar4 = vNodes->nSize;
            uVar12 = iVar4 + 1;
            vNodes->nSize = uVar12;
            vNodes->pArray[iVar4] = pAVar11;
            uVar1 = vNodes->nCap;
            local_38 = pAVar11;
            if (uVar12 == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
                }
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar1 * 2;
                if (iVar4 <= (int)uVar1) goto LAB_0030785c;
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
                }
              }
              vNodes->pArray = ppvVar7;
              vNodes->nCap = iVar4;
            }
LAB_0030785c:
            pAVar11 = local_48;
            iVar4 = vNodes->nSize;
            uVar12 = iVar4 + 1;
            vNodes->nSize = uVar12;
            vNodes->pArray[iVar4] = pAVar3;
            uVar1 = vNodes->nCap;
            if (uVar12 == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
                }
                iVar4 = 0x10;
              }
              else {
                iVar4 = uVar1 * 2;
                if (iVar4 <= (int)uVar1) goto LAB_003078d9;
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
                }
              }
              vNodes->pArray = ppvVar7;
              vNodes->nCap = iVar4;
            }
LAB_003078d9:
            iVar4 = vNodes->nSize;
            vNodes->nSize = iVar4 + 1;
            vNodes->pArray[iVar4] = pAVar11;
            if (-1 < (long)iVar4) {
              lVar14 = 0;
              do {
                uVar15 = (ulong)vNodes->pArray[lVar14] & 0xfffffffffffffffe;
                if ((*(uint *)(uVar15 + 0x14) & 0x10) == 0) {
                  *(uint *)(uVar15 + 0x14) = *(uint *)(uVar15 + 0x14) | 0x10;
                  lVar13 = (long)(int)uVar16;
                  *(long *)(uVar15 + 0x40) = lVar13;
                  uVar1 = *__ptr;
                  if (uVar16 == uVar1) {
                    if ((int)uVar1 < 0x10) {
                      if (pvVar6 == (void *)0x0) {
                        pvVar6 = malloc(0x80);
                      }
                      else {
                        pvVar6 = realloc(pvVar6,0x80);
                      }
                      uVar12 = 0x10;
                    }
                    else {
                      uVar12 = uVar1 * 2;
                      if ((int)uVar12 <= (int)uVar1) goto LAB_0030798e;
                      if (pvVar6 == (void *)0x0) {
                        pvVar6 = malloc((ulong)uVar1 << 4);
                      }
                      else {
                        pvVar6 = realloc(pvVar6,(ulong)uVar1 << 4);
                      }
                    }
                    *__ptr = uVar12;
                  }
LAB_0030798e:
                  uVar16 = uVar16 + 1;
                  *(ulong *)((long)pvVar6 + lVar13 * 8) = uVar15;
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 < vNodes->nSize);
            }
            iVar4 = Abc_NtkClauseMux(pSat,pAVar9,local_38,local_40,local_48,vVars);
          }
          if (iVar4 == 0) {
            iVar4 = 0;
            goto LAB_00307a23;
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (int)uVar16);
      iVar4 = 1;
LAB_00307a23:
      *(void **)(__ptr + 2) = pvVar6;
    }
    __ptr[1] = uVar16;
  }
  if (vVars->pArray != (int *)0x0) {
    free(vVars->pArray);
    vVars->pArray = (int *)0x0;
  }
  free(vVars);
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (vNodes->pArray != (void **)0x0) {
    free(vNodes->pArray);
    vNodes->pArray = (void **)0x0;
  }
  free(vNodes);
  return iVar4;
}

Assistant:

int Abc_NtkMiterSatCreateInt( sat_solver * pSat, Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode, * pFanin, * pNodeC, * pNodeT, * pNodeE;
    Vec_Ptr_t * vNodes, * vSuper;
    Vec_Int_t * vVars;
    int i, k, fUseMuxes = 1;
//    int fOrderCiVarsFirst = 0;
    int RetValue = 0;

    assert( Abc_NtkIsStrash(pNtk) );

    // clean the CI node pointers
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = NULL;

    // start the data structures
    vNodes  = Vec_PtrAlloc( 1000 );   // the nodes corresponding to vars in the sat_solver
    vSuper  = Vec_PtrAlloc( 100 );    // the nodes belonging to the given implication supergate
    vVars   = Vec_IntAlloc( 100 );    // the temporary array for variables in the clause

    // add the clause for the constant node
    pNode = Abc_AigConst1(pNtk);
    pNode->fMarkA = 1;
    pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
    Vec_PtrPush( vNodes, pNode );
    Abc_NtkClauseTriv( pSat, pNode, vVars );
/*
    // add the PI variables first
    Abc_NtkForEachCi( pNtk, pNode, i )
    {
        pNode->fMarkA = 1;
        pNode->pCopy = (Abc_Obj_t *)vNodes->nSize;
        Vec_PtrPush( vNodes, pNode );
    }
*/
    // collect the nodes that need clauses and top-level assignments
    Vec_PtrClear( vSuper );
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // get the fanin
        pFanin = Abc_ObjFanin0(pNode);
        // create the node's variable
        if ( pFanin->fMarkA == 0 )
        {
            pFanin->fMarkA = 1;
            pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
            Vec_PtrPush( vNodes, pFanin );
        }
        // add the trivial clause
        Vec_PtrPush( vSuper, Abc_ObjChild0(pNode) );
    }
    if ( !Abc_NtkClauseTop( pSat, vSuper, vVars ) )
        goto Quits;


    // add the clauses
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        assert( !Abc_ObjIsComplement(pNode) );
        if ( !Abc_AigNodeIsAnd(pNode) )
            continue;
//printf( "%d ", pNode->Id );

        // add the clauses
        if ( fUseMuxes && Abc_NodeIsMuxType(pNode) )
        {
            nMuxes++;

            pNodeC = Abc_NodeRecognizeMux( pNode, &pNodeT, &pNodeE );
            Vec_PtrClear( vSuper );
            Vec_PtrPush( vSuper, pNodeC );
            Vec_PtrPush( vSuper, pNodeT );
            Vec_PtrPush( vSuper, pNodeE );
            // add the fanin nodes to explore
            Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, k )
            {
                pFanin = Abc_ObjRegular(pFanin);
                if ( pFanin->fMarkA == 0 )
                {
                    pFanin->fMarkA = 1;
                    pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
                    Vec_PtrPush( vNodes, pFanin );
                }
            }
            // add the clauses
            if ( !Abc_NtkClauseMux( pSat, pNode, pNodeC, pNodeT, pNodeE, vVars ) )
                goto Quits;
        }
        else
        {
            // get the supergate
            Abc_NtkCollectSupergate( pNode, fUseMuxes, vSuper );
            // add the fanin nodes to explore
            Vec_PtrForEachEntry( Abc_Obj_t *, vSuper, pFanin, k )
            {
                pFanin = Abc_ObjRegular(pFanin);
                if ( pFanin->fMarkA == 0 )
                {
                    pFanin->fMarkA = 1;
                    pFanin->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)vNodes->nSize;
                    Vec_PtrPush( vNodes, pFanin );
                }
            }
            // add the clauses
            if ( vSuper->nSize == 0 )
            {
                if ( !Abc_NtkClauseTriv( pSat, Abc_ObjNot(pNode), vVars ) )
//                if ( !Abc_NtkClauseTriv( pSat, pNode, vVars ) )
                    goto Quits;
            }
            else
            {
                if ( !Abc_NtkClauseAnd( pSat, pNode, vSuper, vVars ) )
                    goto Quits;
            }
        }
    }
/*
    // set preferred variables
    if ( fOrderCiVarsFirst )
    {
        int * pPrefVars = ABC_ALLOC( int, Abc_NtkCiNum(pNtk) );
        int nVars = 0;
        Abc_NtkForEachCi( pNtk, pNode, i )
        {
            if ( pNode->fMarkA == 0 )
                continue;
            pPrefVars[nVars++] = (int)pNode->pCopy;
        }
        nVars = Abc_MinInt( nVars, 10 );
        ASat_SolverSetPrefVars( pSat, pPrefVars, nVars );
    }
*/
/*
    Abc_NtkForEachObj( pNtk, pNode, i )
    {
        if ( !pNode->fMarkA )
            continue;
        printf( "%10s : ", Abc_ObjName(pNode) );
        printf( "%3d\n", (int)pNode->pCopy );
    }
    printf( "\n" );
*/
    RetValue = 1;
Quits :
    // delete
    Vec_IntFree( vVars );
    Vec_PtrFree( vNodes );
    Vec_PtrFree( vSuper );
    return RetValue;
}